

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::PrintValue<estl::vector_s<unsigned_int,11ul>,void>
               (vector_s<unsigned_int,_11UL> *container,ostream *os)

{
  size_type sVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  sVar1 = container->size_;
  if (sVar1 != 0) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      if (lVar3 == 0) {
LAB_0012aa83:
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
        std::ostream::_M_insert<unsigned_long>((ulong)os);
        lVar3 = lVar3 + 1;
        bVar4 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
        if (lVar3 != 0x20) goto LAB_0012aa83;
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        lVar3 = 0x20;
        bVar4 = true;
      }
    } while ((!bVar4) && (bVar4 = sVar1 * 4 + -4 != lVar2, lVar2 = lVar2 + 4, bVar4));
    if (lVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }